

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O2

indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> * __thiscall
isocpp_p1950::indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo>::operator=
          (indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *this,
          indirect_value<int,_EmptyNo_FinalNo,_EmptyNo_FinalNo> *i)

{
  int *piVar1;
  
  if (this != i) {
    reset(this);
    (this->super_indirect_value_copy_base<EmptyNo_FinalNo,_false>).c_.data =
         (i->super_indirect_value_copy_base<EmptyNo_FinalNo,_false>).c_.data;
    stats::move_assign_count = stats::move_assign_count + 2;
    (this->super_indirect_value_delete_base<EmptyNo_FinalNo,_false>).d_.data =
         (i->super_indirect_value_delete_base<EmptyNo_FinalNo,_false>).d_.data;
    piVar1 = i->ptr_;
    i->ptr_ = (int *)0x0;
    this->ptr_ = piVar1;
  }
  return this;
}

Assistant:

constexpr indirect_value& operator=(indirect_value&& i) noexcept {
    if (this != &i) {
      reset();
      copy_base::operator=(std::move(i));
      delete_base::operator=(std::move(i));
      ptr_ = std::exchange(i.ptr_, nullptr);
    }
    return *this;
  }